

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O3

FT_Error FT_Bitmap_Copy(FT_Library library,FT_Bitmap *source,FT_Bitmap *target)

{
  FT_Memory memory;
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  unsigned_short uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined4 uVar7;
  uint in_EAX;
  uchar *puVar8;
  uchar *__src;
  FT_Error FVar9;
  bool bVar10;
  uint uVar11;
  ulong __n;
  FT_Error error;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (library == (FT_Library)0x0) {
    FVar9 = 0x21;
  }
  else {
    FVar9 = 6;
    if (target != (FT_Bitmap *)0x0 && source != (FT_Bitmap *)0x0) {
      FVar9 = 0;
      if (source != target) {
        if (source->pitch < 0) {
          bVar10 = 0 < target->pitch;
        }
        else if (source->pitch == 0) {
          bVar10 = false;
        }
        else {
          bVar10 = SUB41((uint)target->pitch >> 0x1f,0);
        }
        memory = library->memory;
        ft_mem_free(memory,target->buffer);
        target->buffer = (uchar *)0x0;
        uVar11 = source->width;
        iVar2 = source->pitch;
        uVar3 = *(undefined4 *)&source->field_0xc;
        puVar8 = source->buffer;
        uVar4 = source->num_grays;
        uVar5 = source->pixel_mode;
        uVar6 = source->palette_mode;
        uVar7 = *(undefined4 *)&source->field_0x1c;
        target->rows = source->rows;
        target->width = uVar11;
        target->pitch = iVar2;
        *(undefined4 *)&target->field_0xc = uVar3;
        target->palette = source->palette;
        target->buffer = puVar8;
        target->num_grays = uVar4;
        target->pixel_mode = uVar5;
        target->palette_mode = uVar6;
        *(undefined4 *)&target->field_0x1c = uVar7;
        if (bVar10 != false) {
          target->pitch = -target->pitch;
        }
        FVar9 = 0;
        if (source->buffer != (uchar *)0x0) {
          uVar11 = source->pitch;
          uVar1 = -uVar11;
          if (0 < (int)uVar11) {
            uVar1 = uVar11;
          }
          __n = (ulong)uVar1;
          puVar8 = (uchar *)ft_mem_qrealloc(memory,__n,0,(ulong)target->rows,(void *)0x0,
                                            (FT_Error *)((long)&uStack_38 + 4));
          target->buffer = puVar8;
          if (uStack_38._4_4_ == 0) {
            if (bVar10 == false) {
              memcpy(puVar8,source->buffer,source->rows * __n);
            }
            else {
              uVar11 = target->rows;
              if (uVar11 != 0) {
                puVar8 = puVar8 + (uVar11 - 1) * __n;
                __src = source->buffer;
                do {
                  memcpy(puVar8,__src,__n);
                  __src = __src + __n;
                  puVar8 = puVar8 + -__n;
                  uVar11 = uVar11 - 1;
                } while (uVar11 != 0);
              }
            }
          }
          FVar9 = uStack_38._4_4_;
        }
      }
    }
  }
  return FVar9;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Copy( FT_Library        library,
                  const FT_Bitmap  *source,
                  FT_Bitmap        *target)
  {
    FT_Memory  memory;
    FT_Error   error  = FT_Err_Ok;
    FT_Int     pitch;
    FT_Int     flip;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    if ( source == target )
      return FT_Err_Ok;

    flip = ( source->pitch < 0 && target->pitch > 0 ) ||
           ( source->pitch > 0 && target->pitch < 0 );

    memory = library->memory;
    FT_FREE( target->buffer );

    *target = *source;

    if ( flip )
      target->pitch = -target->pitch;

    if ( !source->buffer )
      return FT_Err_Ok;

    pitch  = source->pitch;
    if ( pitch < 0 )
      pitch = -pitch;

    FT_MEM_QALLOC_MULT( target->buffer, target->rows, pitch );

    if ( !error )
    {
      if ( flip )
      {
        /* take care of bitmap flow */
        FT_UInt   i;
        FT_Byte*  s = source->buffer;
        FT_Byte*  t = target->buffer;


        t += (FT_ULong)pitch * ( target->rows - 1 );

        for ( i = target->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, pitch );

          s += pitch;
          t -= pitch;
        }
      }
      else
        FT_MEM_COPY( target->buffer, source->buffer,
                     (FT_Long)source->rows * pitch );
    }

    return error;
  }